

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STParsedJSON.cpp
# Opt level: O2

Value __thiscall
jbcoin::STParsedJSONDetail::bad_type(STParsedJSONDetail *this,string *object,string *field)

{
  undefined8 extraout_RDX;
  Value VVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  make_name(&local_30,object,field);
  std::operator+(&local_70,"Field \'",&local_30);
  std::operator+(&local_50,&local_70,"\' has bad type.");
  RPC::make_error((RPC *)this,rpcINVALID_PARAMS,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  VVar1._8_8_ = extraout_RDX;
  VVar1.value_.map_ = (ObjectValues *)this;
  return VVar1;
}

Assistant:

static Json::Value bad_type (std::string const& object,
    std::string const& field)
{
    return RPC::make_error (rpcINVALID_PARAMS,
        "Field '" + make_name (object, field) + "' has bad type.");
}